

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_global_hold_socket(nn_sock **sockp,int s)

{
  nn_sock *self;
  int iVar1;
  int iVar2;
  
  nn_mutex_lock(&::self.lock);
  iVar2 = -9;
  if ((((uint)s < 0x200) && (::self.socks != (nn_sock **)0x0)) &&
     (self = ::self.socks[(uint)s], self != (nn_sock *)0x0)) {
    iVar1 = nn_sock_hold(self);
    if (iVar1 == 0) {
      *sockp = self;
      iVar2 = 0;
    }
  }
  nn_mutex_unlock(&::self.lock);
  return iVar2;
}

Assistant:

int nn_global_hold_socket(struct nn_sock **sockp, int s)
{
    int rc;
    nn_mutex_lock(&self.lock);
    rc = nn_global_hold_socket_locked(sockp, s);
    nn_mutex_unlock(&self.lock);
    return rc;
}